

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O2

string * __thiscall
PrintActionsLog::toString_abi_cxx11_(string *__return_storage_ptr__,PrintActionsLog *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"log ",(allocator *)&local_50);
  if ((this->super_BaseAction).status == ERROR) {
    std::__cxx11::string::string((string *)&local_30,(string *)&(this->super_BaseAction).errorMsg);
    std::operator+(&local_50,"Error:",&local_30);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PrintActionsLog::toString() const
{
    std::string msg("log ");
    if(getStatus() == ActionStatus::COMPLETED)
    {
        msg.append("Completed");
    }
    else  if(getStatus() == ActionStatus::ERROR)
    {
        msg.append("Error:" + getErrorMsg());
    }
    else msg.append("Pending");
    return msg;
}